

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int yaml_parser_parse_flow_mapping_value(yaml_parser_t *parser,yaml_event_t *event,int empty)

{
  yaml_parser_state_t *pyVar1;
  int iVar2;
  yaml_token_t *local_40;
  yaml_token_t *local_38;
  yaml_token_t *local_30;
  yaml_token_t *token;
  int empty_local;
  yaml_event_t *event_local;
  yaml_parser_t *parser_local;
  
  if ((parser->token_available == 0) && (iVar2 = yaml_parser_fetch_more_tokens(parser), iVar2 == 0))
  {
    local_38 = (yaml_token_t *)0x0;
  }
  else {
    local_38 = (parser->tokens).head;
  }
  local_30 = local_38;
  if (local_38 == (yaml_token_t *)0x0) {
    parser_local._4_4_ = 0;
  }
  else if (empty == 0) {
    if (local_38->type == YAML_VALUE_TOKEN) {
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      parser->stream_end_produced = (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN);
      (parser->tokens).head = (parser->tokens).head + 1;
      if ((parser->token_available == 0) &&
         (iVar2 = yaml_parser_fetch_more_tokens(parser), iVar2 == 0)) {
        local_40 = (yaml_token_t *)0x0;
      }
      else {
        local_40 = (parser->tokens).head;
      }
      local_30 = local_40;
      if (local_40 == (yaml_token_t *)0x0) {
        return 0;
      }
      if ((local_40->type != YAML_FLOW_ENTRY_TOKEN) &&
         (local_40->type != YAML_FLOW_MAPPING_END_TOKEN)) {
        if (((parser->states).top == (parser->states).end) &&
           (iVar2 = yaml_stack_extend(&(parser->states).start,&(parser->states).top,
                                      &(parser->states).end), iVar2 == 0)) {
          parser->error = YAML_MEMORY_ERROR;
          return 0;
        }
        pyVar1 = (parser->states).top;
        (parser->states).top = pyVar1 + 1;
        *pyVar1 = YAML_PARSE_FLOW_MAPPING_KEY_STATE;
        iVar2 = yaml_parser_parse_node(parser,event,0,0);
        return iVar2;
      }
    }
    parser->state = YAML_PARSE_FLOW_MAPPING_KEY_STATE;
    parser_local._4_4_ = yaml_parser_process_empty_scalar(parser,event,local_30->start_mark);
  }
  else {
    parser->state = YAML_PARSE_FLOW_MAPPING_KEY_STATE;
    parser_local._4_4_ = yaml_parser_process_empty_scalar(parser,event,local_38->start_mark);
  }
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_parse_flow_mapping_value(yaml_parser_t *parser,
        yaml_event_t *event, int empty)
{
    yaml_token_t *token;

    token = PEEK_TOKEN(parser);
    if (!token) return 0;

    if (empty) {
        parser->state = YAML_PARSE_FLOW_MAPPING_KEY_STATE;
        return yaml_parser_process_empty_scalar(parser, event,
                token->start_mark);
    }

    if (token->type == YAML_VALUE_TOKEN) {
        SKIP_TOKEN(parser);
        token = PEEK_TOKEN(parser);
        if (!token) return 0;
        if (token->type != YAML_FLOW_ENTRY_TOKEN
                && token->type != YAML_FLOW_MAPPING_END_TOKEN) {
            if (!PUSH(parser, parser->states,
                        YAML_PARSE_FLOW_MAPPING_KEY_STATE))
                return 0;
            return yaml_parser_parse_node(parser, event, 0, 0);
        }
    }

    parser->state = YAML_PARSE_FLOW_MAPPING_KEY_STATE;
    return yaml_parser_process_empty_scalar(parser, event, token->start_mark);
}